

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O1

int iraf2mem(char *filename,char **buffptr,size_t *buffsize,size_t *filesize,int *status)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  uint3 uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char *hstring;
  uint uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  byte *pbVar16;
  FILE *pFVar17;
  size_t sVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  byte *pbVar23;
  ulong uVar24;
  int extraout_EDX;
  int extraout_EDX_00;
  int nc;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int nc_00;
  long lVar25;
  ushort *puVar26;
  ushort *__ptr;
  byte *pbVar27;
  uint uVar28;
  int iVar29;
  char *cheader;
  uint uVar30;
  FILE *pFVar31;
  ulong uVar32;
  bool bVar33;
  int naxis2;
  char fitsline [81];
  int lpixhead;
  int npaxis1;
  int naxis4;
  int naxis3;
  int naxis1;
  int lenirafhead;
  int bitpix;
  int nax;
  int npaxis2;
  char endline [81];
  char *local_210;
  uint local_200;
  uint local_1fc;
  FILE *local_1f8;
  size_t *local_1f0;
  ulong local_1e8;
  ulong *local_1e0;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188;
  int *local_180;
  int local_178;
  int local_174;
  int local_170;
  uint local_16c;
  int local_168;
  uint local_164;
  uint local_160;
  int local_15c;
  ulong local_158;
  ulong local_150;
  char *local_148;
  int local_13c;
  char local_138 [254];
  undefined1 local_3a;
  
  *buffptr = (char *)0x0;
  *buffsize = 0;
  *filesize = 0;
  local_1e0 = buffsize;
  pcVar14 = irafrdhead(filename,(int *)&local_164);
  if (pcVar14 == (char *)0x0) {
    *status = 0x68;
    return 0x68;
  }
  builtin_strncpy(local_138,
                  "END                                                                             "
                  ,0x51);
  local_1f8 = (FILE *)buffptr;
  uVar11 = head_version(pcVar14);
  local_1f0 = filesize;
  if (uVar11 == 0) {
    ffpmsg("File not valid IRAF image header");
LAB_001d6899:
    ffpmsg(filename);
    *status = 0x68;
  }
  else {
    iVar12 = local_164 - 0x7fe;
    bVar33 = uVar11 != 2;
    iVar13 = 0x51;
    if (bVar33) {
      iVar12 = local_164 - 0x804;
      iVar13 = 0xa2;
    }
    iVar13 = (iVar12 / iVar13) * 0x50;
    iVar13 = iVar13 + (int)((ulong)((long)(iVar13 + 0x780) * -0x49f49f49) >> 0x20) + 0x780;
    uVar30 = ((iVar13 >> 0xb) - (iVar13 >> 0x1f)) * 0xb40 + 0x3844;
    *local_1e0 = (long)(int)uVar30;
    local_1e8 = (ulong)local_164;
    pcVar15 = (char *)calloc((long)(int)uVar30,1);
    if (pcVar15 == (char *)0x0) {
      snprintf(local_1d8,0x51,"IRAF2FITS Cannot allocate %d-byte FITS header",(ulong)uVar30);
      filesize = local_1f0;
      goto LAB_001d6899;
    }
    *(char **)local_1f8 = pcVar15;
    strncpy(pcVar15,local_138,0x50);
    local_1d8._0_2_ = 0x54;
    local_148 = pcVar15;
    hputc(pcVar15,"SIMPLE",local_1d8);
    pbVar16 = (byte *)(pcVar14 + 0x10);
    if (uVar11 == 2) {
      pbVar16 = (byte *)(pcVar14 + 10);
    }
    bVar2 = *pbVar16;
    swaphead = (int)(bVar2 != 0);
    swapdata = swaphead;
    if (uVar11 != 1) {
      uVar32 = (ulong)(bVar2 != 0);
      swapdata = CONCAT13(pcVar14[uVar32 * 3 + 0xe],
                          CONCAT12(pcVar14[uVar32 + 0xf],
                                   CONCAT11(pcVar14[0x10 - uVar32],
                                            pcVar14[(ulong)(bVar2 == 0) * 3 + 0xe])));
    }
    uVar32 = (ulong)(bVar2 != 0);
    pbVar27 = pbVar16 + 3;
    pbVar1 = pbVar16;
    if (bVar2 != 0) {
      pbVar27 = pbVar16;
      pbVar1 = pbVar16 + 3;
    }
    uVar6 = CONCAT12(pbVar16[uVar32 + 1],CONCAT11(pbVar16[2 - uVar32],*pbVar27));
    uVar30 = ((uint)*pbVar1 * 0x1000000 + (uint)uVar6) - 2;
    local_1fc = uVar11;
    if ((10 < uVar30) || ((0x63fU >> (uVar30 & 0x1f) & 1) == 0)) {
      snprintf(local_1d8,0x51,"Unsupported IRAF data type: %d",(ulong)CONCAT13(*pbVar1,uVar6));
      ffpmsg(local_1d8);
      filesize = local_1f0;
      goto LAB_001d6899;
    }
    local_158 = (ulong)bVar33;
    uVar32 = (ulong)((uint)bVar33 * 2);
    local_180 = status;
    local_150 = uVar32;
    snprintf(local_1d8,0x1e,"%d",(ulong)*(uint *)(&DAT_0021a81c + (ulong)uVar30 * 4));
    hstring = local_148;
    hputc(local_148,"BITPIX",local_1d8);
    hputcom(hstring,"BITPIX","IRAF .imh pixel type");
    pcVar19 = pcVar14 + uVar32 + 0x15;
    pcVar15 = pcVar14 + uVar32 + 0x13;
    pcVar21 = pcVar14 + uVar32 + 0x12;
    pcVar20 = pcVar14 + uVar32 + 0x14;
    if (swaphead == 1) {
      pcVar19 = pcVar14 + uVar32 + 0x12;
      pcVar15 = pcVar14 + uVar32 + 0x14;
      pcVar21 = pcVar14 + uVar32 + 0x15;
      pcVar20 = pcVar14 + uVar32 + 0x13;
    }
    uVar11 = CONCAT13(*pcVar21,CONCAT12(*pcVar15,CONCAT11(*pcVar20,*pcVar19)));
    snprintf(local_1d8,0x1e,"%d",(ulong)uVar11);
    hputc(hstring,"NAXIS",local_1d8);
    hputcom(hstring,"NAXIS","IRAF .imh naxis");
    uVar32 = (ulong)(bVar33 + 0x16 + (uint)bVar33);
    pcVar15 = pcVar14 + uVar32 + 1;
    pcVar21 = pcVar14 + uVar32 + 3;
    pcVar19 = pcVar14 + uVar32;
    pcVar20 = pcVar14 + uVar32 + 2;
    if (swaphead != 1) {
      pcVar19 = pcVar21;
      pcVar20 = pcVar15;
      pcVar21 = pcVar14 + uVar32;
      pcVar15 = pcVar14 + uVar32 + 2;
    }
    snprintf(local_1d8,0x1e,"%d",
             (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar20,CONCAT11(*pcVar15,*pcVar19))));
    hputc(hstring,"NAXIS1",local_1d8);
    hputcom(hstring,"NAXIS1","IRAF .imh image naxis[1]");
    if ((int)uVar11 < 2) {
      local_210 = hstring + 0x140;
      iVar13 = extraout_EDX;
    }
    else {
      pcVar19 = pcVar14 + uVar32 + 7;
      pcVar15 = pcVar14 + uVar32 + 5;
      pcVar21 = pcVar14 + uVar32 + 4;
      pcVar20 = pcVar14 + uVar32 + 6;
      if (swaphead == 1) {
        pcVar19 = pcVar14 + uVar32 + 4;
        pcVar15 = pcVar14 + uVar32 + 6;
        pcVar21 = pcVar14 + uVar32 + 7;
        pcVar20 = pcVar14 + uVar32 + 5;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar15,CONCAT11(*pcVar20,*pcVar19))));
      hputc(hstring,"NAXIS2",local_1d8);
      hputcom(hstring,"NAXIS2","IRAF .imh image naxis[2]");
      local_210 = hstring + 400;
      iVar13 = extraout_EDX_00;
    }
    if (2 < (int)uVar11) {
      pcVar19 = pcVar14 + uVar32 + 0xb;
      pcVar15 = pcVar14 + uVar32 + 9;
      pcVar21 = pcVar14 + uVar32 + 8;
      pcVar20 = pcVar14 + uVar32 + 10;
      if (swaphead == 1) {
        pcVar19 = pcVar14 + uVar32 + 8;
        pcVar15 = pcVar14 + uVar32 + 10;
        pcVar21 = pcVar14 + uVar32 + 0xb;
        pcVar20 = pcVar14 + uVar32 + 9;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar15,CONCAT11(*pcVar20,*pcVar19))));
      hputc(hstring,"NAXIS3",local_1d8);
      hputcom(hstring,"NAXIS3","IRAF .imh image naxis[3]");
      local_210 = local_210 + 0x50;
      iVar13 = extraout_EDX_01;
    }
    if (3 < (int)uVar11) {
      pcVar19 = pcVar14 + uVar32 + 0xf;
      pcVar15 = pcVar14 + uVar32 + 0xd;
      pcVar21 = pcVar14 + uVar32 + 0xc;
      pcVar20 = pcVar14 + uVar32 + 0xe;
      if (swaphead == 1) {
        pcVar19 = pcVar14 + uVar32 + 0xc;
        pcVar15 = pcVar14 + uVar32 + 0xe;
        pcVar21 = pcVar14 + uVar32 + 0xf;
        pcVar20 = pcVar14 + uVar32 + 0xd;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar15,CONCAT11(*pcVar20,*pcVar19))));
      hputc(hstring,"NAXIS4",local_1d8);
      hputcom(hstring,"NAXIS4","IRAF .imh image naxis[4]");
      local_210 = local_210 + 0x50;
      iVar13 = extraout_EDX_02;
    }
    if (local_1fc == 2) {
      pcVar15 = irafgetc(pcVar14,0x27e,0x17f);
    }
    else {
      pcVar15 = irafgetc2(pcVar14,0x2dc,iVar13);
    }
    iVar13 = (int)local_158;
    sVar18 = strlen(pcVar15);
    iVar12 = (int)sVar18;
    if (iVar12 < 8) {
      memset(pcVar15 + iVar12,0x20,(ulong)(7 - iVar12) + 1);
      pcVar15[8] = '\0';
    }
    hputs(hstring,"OBJECT",pcVar15);
    hputcom(hstring,"OBJECT","IRAF .imh title");
    free(pcVar15);
    uVar32 = (ulong)(iVar13 * 2 + 0x32);
    pcVar15 = pcVar14 + uVar32 + 1;
    pcVar21 = pcVar14 + uVar32 + 3;
    pcVar19 = pcVar14 + uVar32;
    pcVar20 = pcVar14 + uVar32 + 2;
    if (swaphead != 1) {
      pcVar19 = pcVar21;
      pcVar20 = pcVar15;
      pcVar21 = pcVar14 + uVar32;
      pcVar15 = pcVar14 + uVar32 + 2;
    }
    snprintf(local_1d8,0x1e,"%d",
             (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar20,CONCAT11(*pcVar15,*pcVar19))));
    hputc(hstring,"NPAXIS1",local_1d8);
    hputcom(hstring,"NPAXIS1","IRAF .imh physical naxis[1]");
    if ((int)uVar11 < 2) {
      local_210 = local_210 + 0xa0;
    }
    else {
      pcVar19 = pcVar14 + uVar32 + 7;
      pcVar15 = pcVar14 + uVar32 + 5;
      pcVar21 = pcVar14 + uVar32 + 4;
      pcVar20 = pcVar14 + uVar32 + 6;
      if (swaphead == 1) {
        pcVar19 = pcVar14 + uVar32 + 4;
        pcVar15 = pcVar14 + uVar32 + 6;
        pcVar21 = pcVar14 + uVar32 + 7;
        pcVar20 = pcVar14 + uVar32 + 5;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar15,CONCAT11(*pcVar20,*pcVar19))));
      hputc(hstring,"NPAXIS2",local_1d8);
      hputcom(hstring,"NPAXIS2","IRAF .imh physical naxis[2]");
      local_210 = local_210 + 0xf0;
    }
    if (2 < (int)uVar11) {
      pcVar20 = pcVar14 + uVar32 + 9;
      uVar24 = uVar32 | 8;
      pcVar15 = pcVar14 + uVar24 + 3;
      pcVar19 = pcVar14 + uVar24;
      pcVar21 = pcVar14 + uVar24 + 2;
      if (swaphead != 1) {
        pcVar19 = pcVar15;
        pcVar21 = pcVar20;
        pcVar15 = pcVar14 + uVar24;
        pcVar20 = pcVar14 + uVar24 + 2;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar15,CONCAT12(*pcVar21,CONCAT11(*pcVar20,*pcVar19))));
      hputc(hstring,"NPAXIS3",local_1d8);
      hputcom(hstring,"NPAXIS3","IRAF .imh physical naxis[3]");
      local_210 = local_210 + 0x50;
    }
    if (3 < (int)uVar11) {
      pcVar19 = pcVar14 + uVar32 + 0xf;
      pcVar15 = pcVar14 + uVar32 + 0xd;
      pcVar21 = pcVar14 + uVar32 + 0xc;
      pcVar20 = pcVar14 + uVar32 + 0xe;
      if (swaphead == 1) {
        pcVar19 = pcVar14 + uVar32 + 0xc;
        pcVar15 = pcVar14 + uVar32 + 0xe;
        pcVar21 = pcVar14 + uVar32 + 0xf;
        pcVar20 = pcVar14 + uVar32 + 0xd;
      }
      snprintf(local_1d8,0x1e,"%d",
               (ulong)CONCAT13(*pcVar21,CONCAT12(*pcVar15,CONCAT11(*pcVar20,*pcVar19))));
      hputc(hstring,"NPAXIS4",local_1d8);
      hputcom(hstring,"NPAXIS4","IRAF .imh physical naxis[4]");
      local_210 = local_210 + 0x50;
    }
    hputs(hstring,"IMHFILE",filename);
    hputcom(hstring,"IMHFILE","IRAF header file name");
    uVar11 = local_1fc;
    if (local_1fc == 2) {
      pcVar15 = irafgetc(pcVar14,0x7e,0xff);
    }
    else {
      pcVar15 = irafgetc2(pcVar14,0x19c,nc_00);
    }
    iVar13 = strncmp(pcVar15,"HDR",3);
    if ((iVar13 == 0) && (pcVar21 = same_path(pcVar15,filename), pcVar21 != (char *)0x0)) {
      free(pcVar15);
      pcVar15 = pcVar21;
    }
    pcVar21 = strchr(pcVar15,0x2f);
    if (((pcVar21 == (char *)0x0) && (pcVar21 = strchr(pcVar15,0x24), pcVar21 == (char *)0x0)) &&
       (pcVar21 = same_path(pcVar15,filename), pcVar21 != (char *)0x0)) {
      free(pcVar15);
      pcVar15 = pcVar21;
    }
    uVar32 = local_150;
    lVar25 = local_150 + 0x56;
    pcVar20 = strchr(pcVar15,0x21);
    pcVar21 = pcVar15;
    if (pcVar20 != (char *)0x0) {
      pcVar21 = pcVar20 + 1;
    }
    hputs(hstring,"PIXFILE",pcVar21);
    free(pcVar15);
    hputcom(hstring,"PIXFILE","IRAF .pix pixel file");
    pbVar16 = (byte *)(pcVar14 + uVar32 + 0x57);
    pbVar1 = (byte *)(pcVar14 + uVar32 + 0x59);
    pbVar23 = (byte *)(pcVar14 + lVar25);
    pbVar27 = (byte *)(pcVar14 + uVar32 + 0x58);
    if (swaphead != 1) {
      pbVar23 = pbVar1;
      pbVar27 = pbVar16;
      pbVar1 = (byte *)(pcVar14 + lVar25);
      pbVar16 = (byte *)(pcVar14 + uVar32 + 0x58);
    }
    snprintf(local_1d8,0x1e,"%d",
             (ulong)(((uint)*pbVar1 * 0x2000000 +
                     ((uint)*pbVar16 * 0x200 + (uint)*pbVar23 * 2 | (uint)*pbVar27 << 0x11)) - 2));
    hputc(hstring,"PIXOFF",local_1d8);
    hputcom(hstring,"PIXOFF","IRAF .pix pixel offset (Do not change!)");
    snprintf(local_1d8,0x1e,"%d",(ulong)uVar11);
    hputc(hstring,"IMHVER",local_1d8);
    hputcom(hstring,"IMHVER","IRAF .imh format version (1 or 2)");
    if (swapdata == 0) {
      local_1d8._0_2_ = 0x46;
    }
    else {
      local_1d8._0_2_ = 0x54;
    }
    hputc(hstring,"PIXSWAP",local_1d8);
    uVar32 = local_1e8;
    hputcom(hstring,"PIXSWAP","IRAF pixels, FITS byte orders differ if T");
    local_210 = local_210 + 400;
    local_188 = 0;
    if (uVar11 == 2) {
      local_198 = 0x2020202020202020;
      uStack_190 = 0x2020202020202020;
      local_1a8 = 0x2020202020202020;
      uStack_1a0 = 0x2020202020202020;
      local_1b8 = 0x2020202020202020;
      uStack_1b0 = 0x2020202020202020;
      local_1c8 = 0x2020202020202020;
      uStack_1c0 = 0x2020202020202020;
      local_1d8 = (undefined1  [8])0x2020202020202020;
      uStack_1d0 = 0x2020202020202020;
      if (0x7fe < (int)uVar32) {
        iVar13 = 0;
        uVar32 = 0x7fe;
        do {
          cVar3 = pcVar14[uVar32];
          if (cVar3 == '\n') {
            strncpy(local_210,local_1d8,0x50);
            uVar9 = local_1d8._0_4_;
            uVar10 = local_1d8._3_4_;
            local_1c8 = 0x2020202020202020;
            uStack_1c0 = 0x2020202020202020;
            local_1b8 = 0x2020202020202020;
            uStack_1b0 = 0x2020202020202020;
            local_1a8 = 0x2020202020202020;
            uStack_1a0 = 0x2020202020202020;
            local_198 = 0x2020202020202020;
            uStack_190 = 0x2020202020202020;
            local_1d8 = (undefined1  [8])0x2020202020202020;
            uStack_1d0 = 0x2020202020202020;
            if (uVar10 != 0x20544345 || uVar9 != 0x454a424f) {
              local_210 = local_210 + 0x50;
            }
            iVar13 = 0;
          }
          else {
            if (cVar3 == '\0') break;
            if (0x50 < iVar13) {
              uVar9 = local_1d8._0_4_;
              if (local_1d8._3_4_ != 0x20544345 || uVar9 != 0x454a424f) {
                strncpy(local_210,local_1d8,0x50);
                local_210 = local_210 + 0x50;
                iVar13 = 9;
              }
              local_198 = 0x2020202020202020;
              uStack_190 = 0x2020202020202020;
              local_1a8 = 0x2020202020202020;
              uStack_1a0 = 0x2020202020202020;
              local_1b8 = 0x2020202020202020;
              uStack_1b0 = 0x2020202020202020;
              local_1c8 = 0x2020202020202020;
              uStack_1c0 = 0x2020202020202020;
              local_1d8 = (undefined1  [8])0x2020202020202020;
              uStack_1d0 = 0x2020202020202020;
            }
            if ((byte)(cVar3 - 0x21U) < 0x5e) {
              local_1d8[iVar13] = cVar3;
            }
            iVar13 = iVar13 + 1;
          }
          uVar32 = uVar32 + 1;
        } while (local_1e8 != uVar32);
      }
    }
    else {
      local_1d8 = (undefined1  [8])0x2020202020202020;
      uStack_1d0 = 0x2020202020202020;
      local_1c8 = 0x2020202020202020;
      uStack_1c0 = 0x2020202020202020;
      local_1b8 = 0x2020202020202020;
      uStack_1b0 = 0x2020202020202020;
      local_1a8 = 0x2020202020202020;
      uStack_1a0 = 0x2020202020202020;
      local_198 = 0x2020202020202020;
      uStack_190 = 0x2020202020202020;
      if (0x804 < (int)uVar32) {
        bVar33 = swaphead != 1;
        iVar13 = 0;
        lVar25 = 0x804;
        do {
          cVar3 = pcVar14[lVar25 + (ulong)bVar33];
          uVar9 = local_1d8._0_4_;
          if (cVar3 == '\n') {
            if (local_1d8._3_4_ != 0x20544345 || uVar9 != 0x454a424f) {
              strncpy(local_210,local_1d8,0x50);
              local_210 = local_210 + 0x50;
            }
            local_198 = 0x2020202020202020;
            uStack_190 = 0x2020202020202020;
            local_1a8 = 0x2020202020202020;
            uStack_1a0 = 0x2020202020202020;
            local_1b8 = 0x2020202020202020;
            uStack_1b0 = 0x2020202020202020;
            local_1c8 = 0x2020202020202020;
            uStack_1c0 = 0x2020202020202020;
            local_1d8 = (undefined1  [8])0x2020202020202020;
            uStack_1d0 = 0x2020202020202020;
            iVar13 = 0;
          }
          else {
            if (cVar3 == '\0') break;
            if (0x50 < iVar13) {
              if (local_1d8._3_4_ != 0x20544345 || uVar9 != 0x454a424f) {
                strncpy(local_210,local_1d8,0x50);
                local_210 = local_210 + 0x50;
                iVar13 = 9;
              }
              local_198 = 0x2020202020202020;
              uStack_190 = 0x2020202020202020;
              local_1a8 = 0x2020202020202020;
              uStack_1a0 = 0x2020202020202020;
              local_1b8 = 0x2020202020202020;
              uStack_1b0 = 0x2020202020202020;
              local_1c8 = 0x2020202020202020;
              uStack_1c0 = 0x2020202020202020;
              local_1d8 = (undefined1  [8])0x2020202020202020;
              uStack_1d0 = 0x2020202020202020;
            }
            if ((byte)(cVar3 - 0x21U) < 0x5e) {
              local_1d8[iVar13] = cVar3;
            }
            iVar13 = iVar13 + 1;
          }
          lVar25 = lVar25 + 2;
        } while ((int)lVar25 < (int)local_1e8);
      }
    }
    strncpy(local_210,local_138,0x50);
    pcVar15 = ksearch(hstring,"END");
    status = local_180;
    filesize = local_1f0;
    uVar32 = *local_1e0;
    pcVar15 = pcVar15 + 0x50;
    *local_1f0 = (long)pcVar15 - (long)hstring;
    local_138[2] = 0x20;
    local_138[0] = ' ';
    local_138[1] = ' ';
    if (pcVar15 < hstring + (int)(uVar32 / 0xb40) * 0xb40) {
      do {
        strncpy(pcVar15,local_138,0x50);
        pcVar15 = pcVar15 + 0x50;
      } while (pcVar15 < hstring + (int)(uVar32 / 0xb40) * 0xb40);
    }
  }
  free(pcVar14);
  pFVar31 = local_1f8;
  if (0 < *status) {
    return *status;
  }
  *filesize = ((*filesize - 1) / 0xb40) * 0xb40 + 0xb40;
  local_15c = 1;
  local_168 = 1;
  local_200 = 1;
  local_16c = 1;
  local_170 = 1;
  local_174 = 1;
  local_178 = 0;
  pcVar14 = *(char **)local_1f8;
  pcVar15 = hgetc(pcVar14,"PIXFILE");
  if (pcVar15 != (char *)0x0) {
    sVar18 = strlen(pcVar15);
    if ((int)sVar18 < 0xff) {
      strcpy(local_138,pcVar15);
    }
    else {
      strncpy(local_138,pcVar15,0xfe);
      local_3a = 0;
      pFVar31 = local_1f8;
    }
  }
  hgeti4(pcVar14,"PIXOFF",&local_178);
  pcVar21 = strchr(local_138,0x21);
  pcVar15 = pcVar21 + 1;
  if (pcVar21 == (char *)0x0) {
    pcVar15 = local_138;
  }
  pFVar17 = fopen(pcVar15,"rb");
  iVar13 = local_178;
  if (pFVar17 == (FILE *)0x0) {
    ffpmsg("IRAFRIMAGE: Cannot open IRAF pixel file:");
    ffpmsg(local_138);
    local_180 = status;
  }
  else {
    sVar18 = (size_t)local_178;
    pcVar15 = (char *)calloc(sVar18,1);
    if (pcVar15 == (char *)0x0) {
      ffpmsg("IRAFRIMAGE: Cannot alloc memory for pixel header");
      ffpmsg(local_138);
    }
    else {
      sVar18 = fread(pcVar15,1,sVar18,pFVar17);
      if ((int)sVar18 < iVar13) {
        pcVar14 = local_1d8;
        snprintf(pcVar14,0x51,"IRAF pixel file: %d / %d bytes read.",sVar18 & 0xffffffff,0x400);
      }
      else {
        iVar13 = irafncmp(pcVar15,"impix",nc);
        if ((iVar13 == 0) || (iVar13 = strncmp(pcVar15,"impv2",5), iVar13 == 0)) {
          free(pcVar15);
          hgeti4(pcVar14,"NAXIS",&local_15c);
          hgeti4(pcVar14,"NAXIS1",&local_168);
          hgeti4(pcVar14,"NPAXIS1",&local_174);
          iVar13 = local_15c;
          if (1 < local_15c) {
            hgeti4(pcVar14,"NAXIS2",(int *)&local_200);
            hgeti4(pcVar14,"NPAXIS2",&local_13c);
          }
          if (2 < iVar13) {
            hgeti4(pcVar14,"NAXIS3",(int *)&local_16c);
          }
          local_1f8 = pFVar17;
          local_180 = status;
          if (3 < iVar13) {
            hgeti4(pcVar14,"NAXIS4",&local_170);
          }
          hgeti4(pcVar14,"BITPIX",(int *)&local_160);
          iVar13 = local_168;
          uVar11 = local_16c;
          uVar30 = -local_160;
          if (0 < (int)local_160) {
            uVar30 = local_160;
          }
          iVar29 = (uVar30 >> 3) * local_168;
          iVar12 = local_200 * local_16c * iVar29 * local_170;
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar12);
          sVar18 = (size_t)iVar12;
          uVar32 = (((*local_1f0 + sVar18) - 1) / 0xb40) * 0xb40 + 0xb40;
          uVar28 = local_200;
          if (*local_1e0 < uVar32) {
            local_1fc = local_200;
            pcVar14 = (char *)realloc(*(char **)pFVar31,uVar32);
            uVar28 = local_1fc;
            if (pcVar14 == (char *)0x0) {
              snprintf(local_1d8,0x51,"IRAFRIMAGE Cannot allocate %d-byte image buffer",
                       (ulong)(uint)*local_1f0);
              ffpmsg(local_1d8);
              ffpmsg(local_138);
              fclose(local_1f8);
              goto LAB_001d6abb;
            }
          }
          pFVar17 = local_1f8;
          *(char **)pFVar31 = pcVar14;
          *local_1e0 = uVar32;
          __ptr = (ushort *)(pcVar14 + *local_1f0);
          *local_1f0 = uVar32;
          if (local_174 - iVar13 == 0) {
            sVar22 = fread(__ptr,1,sVar18,local_1f8);
            uVar11 = (uint)sVar22;
          }
          else {
            if (1 < (int)uVar11 && uVar28 == 1) {
              local_200 = uVar11;
            }
            if ((int)local_200 < 1) {
              uVar11 = 0;
            }
            else {
              local_1e0 = (ulong *)(long)(int)((local_174 - iVar13) * (uVar30 >> 3));
              iVar13 = 0;
              uVar11 = 0;
              puVar26 = __ptr;
              do {
                sVar22 = fread(puVar26,1,(long)iVar29,pFVar17);
                uVar11 = uVar11 + (int)sVar22;
                fseek(pFVar17,(long)local_1e0,1);
                puVar26 = (ushort *)((long)puVar26 + (long)iVar29);
                iVar13 = iVar13 + 1;
              } while (iVar13 < (int)local_200);
            }
          }
          fclose(pFVar17);
          if ((int)local_1e8 <= (int)uVar11) {
            if (swapdata != 0) {
              switch(local_160 << 0x1c | local_160 + 0x40 >> 4) {
              case 0:
                if (7 < (int)local_1e8) {
                  puVar26 = (ushort *)(sVar18 + (long)__ptr);
                  do {
                    uVar8 = *__ptr;
                    uVar5 = *(undefined1 *)((long)__ptr + 1);
                    uVar7 = __ptr[1];
                    uVar4 = *(undefined1 *)((long)__ptr + 3);
                    *(undefined1 *)__ptr = *(undefined1 *)((long)__ptr + 7);
                    *(char *)((long)__ptr + 1) = (char)__ptr[3];
                    *(undefined1 *)(__ptr + 1) = *(undefined1 *)((long)__ptr + 5);
                    *(char *)((long)__ptr + 3) = (char)__ptr[2];
                    *(undefined1 *)(__ptr + 2) = uVar4;
                    *(char *)((long)__ptr + 5) = (char)uVar7;
                    *(undefined1 *)(__ptr + 3) = uVar5;
                    *(char *)((long)__ptr + 7) = (char)uVar8;
                    __ptr = __ptr + 4;
                  } while (__ptr < puVar26);
                }
                break;
              case 2:
                if (3 < (int)local_1e8) {
                  puVar26 = (ushort *)(sVar18 + (long)__ptr);
                  do {
                    uVar8 = *__ptr;
                    uVar5 = *(undefined1 *)((long)__ptr + 1);
                    *(undefined1 *)__ptr = *(undefined1 *)((long)__ptr + 3);
                    *(char *)((long)__ptr + 1) = (char)__ptr[1];
                    *(undefined1 *)(__ptr + 1) = uVar5;
                    *(char *)((long)__ptr + 3) = (char)uVar8;
                    __ptr = __ptr + 2;
                  } while (__ptr < puVar26);
                }
                break;
              case 3:
                if (1 < (int)local_1e8) {
                  puVar26 = (ushort *)(sVar18 + (long)__ptr);
                  do {
                    *__ptr = *__ptr << 8 | *__ptr >> 8;
                    __ptr = __ptr + 1;
                  } while (__ptr < puVar26);
                }
                break;
              case 5:
                if (1 < (int)local_1e8) {
                  puVar26 = (ushort *)(sVar18 + (long)__ptr);
                  do {
                    *__ptr = *__ptr << 8 | *__ptr >> 8;
                    __ptr = __ptr + 1;
                  } while (__ptr < puVar26);
                }
                break;
              case 6:
                if (3 < (int)local_1e8) {
                  puVar26 = (ushort *)(sVar18 + (long)__ptr);
                  do {
                    uVar8 = *__ptr;
                    uVar5 = *(undefined1 *)((long)__ptr + 1);
                    *(undefined1 *)__ptr = *(undefined1 *)((long)__ptr + 3);
                    *(char *)((long)__ptr + 1) = (char)__ptr[1];
                    *(undefined1 *)(__ptr + 1) = uVar5;
                    *(char *)((long)__ptr + 3) = (char)uVar8;
                    __ptr = __ptr + 2;
                  } while (__ptr < puVar26);
                }
              }
            }
            goto switchD_001d780f_caseD_1;
          }
          snprintf(local_1d8,0x51,"IRAF pixel file: %d / %d bytes read.",(ulong)uVar11);
          ffpmsg(local_1d8);
          ffpmsg(local_138);
          goto LAB_001d6abb;
        }
        ffpmsg("File not valid IRAF pixel file:");
        pcVar14 = local_138;
      }
      ffpmsg(pcVar14);
      free(pcVar15);
    }
    fclose(pFVar17);
    local_180 = status;
  }
LAB_001d6abb:
  *local_180 = 0x68;
switchD_001d780f_caseD_1:
  return *local_180;
}

Assistant:

int iraf2mem(char *filename,     /* name of input file                 */
             char **buffptr,     /* O - memory pointer (initially NULL)    */
             size_t *buffsize,   /* O - size of mem buffer, in bytes        */
             size_t *filesize,   /* O - size of FITS file, in bytes         */
             int *status)        /* IO - error status                       */

/*
   Driver routine that reads an IRAF image into memory, also converting
   it into FITS format.
*/
{
    char *irafheader;
    int lenirafhead;

    *buffptr = NULL;
    *buffsize = 0;
    *filesize = 0;

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    /* convert IRAF header to FITS header in memory */
    iraftofits(filename, irafheader, lenirafhead, buffptr, buffsize, filesize,
               status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    *filesize = (((*filesize - 1) / 2880 ) + 1 ) * 2880; /* multiple of 2880 */

    /* append the image data onto the FITS header */
    irafrdimage(buffptr, buffsize, filesize, status);

    return(*status);
}